

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readandsynthesis.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int fs;
  int y_length;
  char *pcVar2;
  double *f0;
  double *temporal_positions;
  double **spectrogram;
  double **aperiodicity;
  double *pdVar3;
  double **ppdVar4;
  char cVar5;
  int i;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint f0_length;
  ulong uVar9;
  double dVar10;
  double dVar11;
  char filename [200];
  
  iVar1 = 0;
  if (1 < argc) {
    pcVar2 = argv[1];
    if (((*pcVar2 == '-') && (pcVar2[1] == 'h')) && (pcVar2[2] == '\0')) {
      anon_unknown.dwarf_114::usage(*argv);
      iVar1 = -1;
    }
    else {
      dVar10 = GetHeaderInformation(pcVar2,"NOF ");
      f0_length = (uint)dVar10;
      dVar10 = GetHeaderInformation(argv[2],"FFT ");
      iVar1 = (int)dVar10;
      dVar10 = GetHeaderInformation(argv[2],"FS  ");
      fs = (int)dVar10;
      dVar10 = GetHeaderInformation(argv[2],"FP  ");
      memcpy(filename,"output.wav",200);
      uVar8 = (ulong)(argc - 1);
      do {
        uVar7 = uVar8 - 1;
        pcVar2 = argv[uVar8];
        if (*pcVar2 == '-') {
          cVar5 = pcVar2[1];
          if (cVar5 == 'o') {
            if (pcVar2[2] == '\0') {
              snprintf(filename,200,argv[(uint)argc]);
              pcVar2 = argv[uVar8];
              if (*pcVar2 == '-') {
                cVar5 = pcVar2[1];
                goto LAB_001013c9;
              }
            }
          }
          else {
LAB_001013c9:
            if ((cVar5 == 'h') && (pcVar2[2] == '\0')) {
              anon_unknown.dwarf_114::usage(*argv);
              goto LAB_00101779;
            }
          }
        }
        argc = argc - 1;
        uVar8 = uVar7;
      } while ((int)uVar7 != 0);
      uVar8 = (long)(int)f0_length * 8;
      if ((int)f0_length < 0) {
        uVar8 = 0xffffffffffffffff;
      }
      f0 = (double *)operator_new__(uVar8);
      temporal_positions = (double *)operator_new__(uVar8);
      spectrogram = (double **)operator_new__(uVar8);
      aperiodicity = (double **)operator_new__(uVar8);
      uVar8 = (ulong)f0_length;
      if (0 < (int)f0_length) {
        uVar7 = (long)(iVar1 / 2) * 8 + 8;
        if (iVar1 < -3) {
          uVar7 = 0xffffffffffffffff;
        }
        uVar9 = 0;
        do {
          pdVar3 = (double *)operator_new__(uVar7);
          spectrogram[uVar9] = pdVar3;
          pdVar3 = (double *)operator_new__(uVar7);
          aperiodicity[uVar9] = pdVar3;
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      ReadF0(argv[1],temporal_positions,f0);
      dVar11 = GetHeaderInformation(argv[2],"NOD ");
      uVar6 = (uint)dVar11;
      pcVar2 = argv[2];
      if (uVar6 == 0) {
        ReadSpectralEnvelope(pcVar2,spectrogram);
      }
      else {
        uVar7 = uVar8 * 8;
        if ((int)f0_length < 0) {
          uVar7 = 0xffffffffffffffff;
        }
        ppdVar4 = (double **)operator_new__(uVar7);
        if ((int)f0_length < 1) {
          ReadSpectralEnvelope(pcVar2,ppdVar4);
          DecodeSpectralEnvelope(ppdVar4,f0_length,fs,iVar1,uVar6,spectrogram);
        }
        else {
          uVar7 = (ulong)uVar6 << 3;
          if ((int)uVar6 < 0) {
            uVar7 = 0xffffffffffffffff;
          }
          uVar9 = 0;
          do {
            pdVar3 = (double *)operator_new__(uVar7);
            ppdVar4[uVar9] = pdVar3;
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
          ReadSpectralEnvelope(pcVar2,ppdVar4);
          DecodeSpectralEnvelope(ppdVar4,f0_length,fs,iVar1,uVar6,spectrogram);
          uVar7 = 0;
          do {
            if (ppdVar4[uVar7] != (double *)0x0) {
              operator_delete__(ppdVar4[uVar7]);
            }
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
        operator_delete__(ppdVar4);
      }
      dVar11 = GetHeaderInformation(argv[3],"NOD ");
      uVar6 = (uint)dVar11;
      pcVar2 = argv[3];
      if (uVar6 == 0) {
        ReadAperiodicity(pcVar2,aperiodicity);
      }
      else {
        uVar7 = uVar8 * 8;
        if ((int)f0_length < 0) {
          uVar7 = 0xffffffffffffffff;
        }
        ppdVar4 = (double **)operator_new__(uVar7);
        if ((int)f0_length < 1) {
          ReadAperiodicity(pcVar2,ppdVar4);
          DecodeAperiodicity(ppdVar4,f0_length,fs,iVar1,aperiodicity);
        }
        else {
          uVar7 = (ulong)uVar6 << 3;
          if ((int)uVar6 < 0) {
            uVar7 = 0xffffffffffffffff;
          }
          uVar9 = 0;
          do {
            pdVar3 = (double *)operator_new__(uVar7);
            ppdVar4[uVar9] = pdVar3;
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
          ReadAperiodicity(pcVar2,ppdVar4);
          DecodeAperiodicity(ppdVar4,f0_length,fs,iVar1,aperiodicity);
          uVar7 = 0;
          do {
            if (ppdVar4[uVar7] != (double *)0x0) {
              operator_delete__(ppdVar4[uVar7]);
            }
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
        operator_delete__(ppdVar4);
      }
      y_length = (int)((double)fs * ((dVar10 * (double)(int)f0_length) / 1000.0));
      uVar7 = 0xffffffffffffffff;
      if (-1 < y_length) {
        uVar7 = (long)y_length * 8;
      }
      pdVar3 = (double *)operator_new__(uVar7);
      Synthesis(f0,f0_length,spectrogram,aperiodicity,iVar1,dVar10,fs,y_length,pdVar3);
      wavwrite(pdVar3,y_length,fs,0x10,filename);
      operator_delete__(pdVar3);
      if (0 < (int)f0_length) {
        uVar7 = 0;
        do {
          if (spectrogram[uVar7] != (double *)0x0) {
            operator_delete__(spectrogram[uVar7]);
          }
          if (aperiodicity[uVar7] != (double *)0x0) {
            operator_delete__(aperiodicity[uVar7]);
          }
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      operator_delete__(spectrogram);
      operator_delete__(aperiodicity);
      operator_delete__(f0);
      operator_delete__(temporal_positions);
LAB_00101779:
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
  // Command check
  if (argc < 2) return 0;
  if (0 == strcmp(argv[1], "-h")) {
    usage(argv[0]);
    return -1;
  }

  // Get parameters required for memory allocation
  int f0_length = static_cast<int>(GetHeaderInformation(argv[1], "NOF "));
  int fft_size = static_cast<int>(GetHeaderInformation(argv[2], "FFT "));
  int fs = static_cast<int>(GetHeaderInformation(argv[2], "FS  "));
  double frame_period = GetHeaderInformation(argv[2], "FP  ");
  char filename[200] = "output.wav";

  // Option from command line
  if (SetOption(argc, argv, filename) == 0) return 0;

  // Memory allocation
  double *f0 = new double[f0_length];
  double *temporal_positions = new double[f0_length];
  double **spectrogram = new double *[f0_length];
  double **aperiodicity = new double *[f0_length];
  for (int i = 0; i < f0_length; ++i) {
    spectrogram[i] = new double[fft_size / 2 + 1];
    aperiodicity[i] = new double[fft_size / 2 + 1];
  }

  // Read F0
  ReadF0(argv[1], temporal_positions, f0);

  // Read spectral envelope
  int number_of_dimensions =
    static_cast<int>(GetHeaderInformation(argv[2], "NOD "));
  if (number_of_dimensions == 0) {
    // If the spectral envelope is not coded.
    ReadSpectralEnvelope(argv[2], spectrogram);
  } else {
    // If the spectral envelope is coded.
    ReadCodedSpectralEnvelope(argv[2], f0_length, fs, fft_size,
      number_of_dimensions, spectrogram);
  }

  // Read aperiodicity
  number_of_dimensions =
    static_cast<int>(GetHeaderInformation(argv[3], "NOD "));
  if (number_of_dimensions == 0) {
    // If the aperiodicity is not coded.
    ReadAperiodicity(argv[3], aperiodicity);
  } else {
    // If the aperiodicity is coded.
    ReadCodedAperiodicity(argv[3], f0_length, fs, fft_size,
        number_of_dimensions, aperiodicity);
  }

  // Synthesis
  int y_length = static_cast<int>(f0_length * frame_period / 1000.0 * fs);
  double *y = new double[y_length];
  Synthesis(f0, f0_length, spectrogram, aperiodicity, fft_size, frame_period,
      fs, y_length, y);

  // File output
  wavwrite(y, y_length, fs, 16, filename);

  // Memory deallocation
  delete[] y;
  for (int i = 0; i < f0_length; ++i) {
    delete[] spectrogram[i];
    delete[] aperiodicity[i];
  }
  delete[] spectrogram;
  delete[] aperiodicity;
  delete[] f0;
  delete[] temporal_positions;
  return 0;
}